

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

void __thiscall ON_BrepFace::~ON_BrepFace(ON_BrepFace *this)

{
  Impl *pIVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0080caa8;
  DestroyMesh(this,any_mesh);
  ON_SimpleArray<int>::SetCapacity(&this->m_li,0);
  pIVar1 = this->m_pImpl;
  if (pIVar1 != (Impl *)0x0) {
    p_Var2 = (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  operator_delete(pIVar1,0x58);
  ON_SimpleArray<int>::~ON_SimpleArray(&this->m_li);
  ON_SurfaceProxy::~ON_SurfaceProxy(&this->super_ON_SurfaceProxy);
  return;
}

Assistant:

ON_BrepFace::~ON_BrepFace()
{
  DestroyMesh(ON::any_mesh);
  m_li.Destroy();
  delete m_pImpl;
}